

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

int64_t __thiscall
aeron::archive::AeronArchive::startReplay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId)

{
  int64_t iVar1;
  int64_t local_78;
  int32_t local_6c;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  int64_t local_40;
  int64_t local_38;
  
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_78 = recordingId;
  local_6c = replayStreamId;
  local_40 = length;
  local_38 = position;
  local_68._M_unused._M_object = operator_new(0x30);
  *(AeronArchive **)local_68._M_unused._0_8_ = this;
  *(int64_t **)((long)local_68._M_unused._0_8_ + 8) = &local_78;
  *(int64_t **)((long)local_68._M_unused._0_8_ + 0x10) = &local_38;
  *(int64_t **)((long)local_68._M_unused._0_8_ + 0x18) = &local_40;
  *(string **)((long)local_68._M_unused._0_8_ + 0x20) = replayChannel;
  *(int32_t **)((long)local_68._M_unused._0_8_ + 0x28) = &local_6c;
  pcStack_50 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:203:9)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:203:9)>
             ::_M_manager;
  iVar1 = callAndPollForResponse(this,(function<bool_(long)> *)&local_68,"start replay");
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::startReplay(std::int64_t recordingId, std::int64_t position, std::int64_t length,
                                       const std::string& replayChannel, std::int32_t replayStreamId) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return archiveProxy_->replay(recordingId, position, length, replayChannel, replayStreamId, correlationId,
                                         controlSessionId_);
        },
        "start replay");
}